

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.c
# Opt level: O1

void rhash_init_algorithms(uint mask)

{
  rhash_uninitialized_algorithms = 0;
  return;
}

Assistant:

void rhash_init_algorithms(unsigned mask)
{
	(void)mask; /* unused now */

	/* verify that RHASH_HASH_COUNT is the index of the major bit of RHASH_ALL_HASHES */
	assert(1 == (RHASH_ALL_HASHES >> (RHASH_HASH_COUNT - 1)));

#ifdef GENERATE_CRC32_TABLE
	rhash_crc32_init_table();
#endif
#ifdef GENERATE_GOST_LOOKUP_TABLE
	rhash_gost_init_table();
#endif
	rhash_uninitialized_algorithms = 0;
}